

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress.cpp
# Opt level: O1

void duckdb::roaring::RoaringCompressState::HandleAllValid(RoaringCompressState *state,idx_t amount)

{
  ushort uVar1;
  undefined2 uVar2;
  undefined2 uVar3;
  undefined1 auVar4 [16];
  
  uVar1 = (state->container_state).length;
  if ((uVar1 != 0) && ((state->container_state).last_bit_set == false)) {
    (*(state->container_state).append_function)(&state->container_state,true,uVar1);
    (state->container_state).last_is_null = true;
    uVar2 = (state->container_state).appended_count;
    uVar3 = (state->container_state).null_count;
    auVar4 = pshuflw(ZEXT216(uVar1),ZEXT216(uVar1),0);
    (state->container_state).appended_count = auVar4._0_2_ + uVar2;
    (state->container_state).null_count = auVar4._2_2_ + uVar3;
    (state->container_state).length = 0;
  }
  (state->container_state).length = (state->container_state).length + (short)amount;
  (state->container_state).last_bit_set = true;
  return;
}

Assistant:

void RoaringCompressState::HandleAllValid(RoaringCompressState &state, idx_t amount) {
	auto &container_state = state.container_state;
	if (container_state.length && container_state.last_bit_set == false) {
		container_state.Append(!container_state.last_bit_set, container_state.length);
		container_state.length = 0;
	}
	container_state.length += amount;
	container_state.last_bit_set = true;
}